

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

BinaryExpr<const_Jinx::Variant_&,_const_int_&> * __thiscall
Catch::ExprLhs<Jinx::Variant_const&>::operator<
          (BinaryExpr<const_Jinx::Variant_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<Jinx::Variant_const&> *this,int *rhs)

{
  int iVar1;
  Variant *pVVar2;
  bool bVar3;
  Variant local_68;
  StringRef local_40;
  
  pVVar2 = *(Variant **)this;
  iVar1 = *rhs;
  local_68.m_type = Null;
  Jinx::Variant::Destroy(&local_68);
  local_68.m_type = Integer;
  local_68.field_1.m_number = (double)(long)iVar1;
  bVar3 = Jinx::operator<(pVVar2,&local_68);
  pVVar2 = *(Variant **)this;
  StringRef::StringRef(&local_40,"<");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar3;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0027ac18;
  __return_storage_ptr__->m_lhs = pVVar2;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  Jinx::Variant::Destroy(&local_68);
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }